

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O1

pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* generateResults(pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *__return_storage_ptr__,RestCommand command,string *brokerName,string_view target,
                 string_view query,
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 *fields)

{
  value_t vVar1;
  pointer pcVar2;
  string_view type_00;
  json_value jVar3;
  data dVar4;
  data dVar5;
  boolean_t bVar6;
  bool bVar7;
  int iVar8;
  CoreType type_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  const_iterator cVar10;
  reference pvVar11;
  TimeRepresentation<count_time<9,_long>_> TVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  size_type sVar15;
  ulong extraout_RAX;
  undefined8 uVar16;
  char *pcVar17;
  char *pcVar18;
  char *extraout_RDX;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar19;
  long lVar20;
  json_value jVar21;
  size_type __rlen;
  char *pcVar22;
  json_value *pjVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  string_view configureString;
  string_view brokerName_00;
  string_view brokerName_01;
  string_view brokerName_02;
  string_view timeString;
  string_view brokerName_03;
  random_generator generator;
  string res;
  json base;
  uuid uuid1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brks;
  string type_1;
  string errorMessage;
  string type;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined1 local_32a [2];
  json_value local_328;
  json_value jStack_320;
  undefined1 local_310 [32];
  char *local_2f0;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8;
  random_generator_pure local_2d9;
  json_value local_2d8;
  json_value jStack_2d0;
  json_value local_2c8;
  undefined1 uStack_2c0;
  undefined1 uStack_2bf;
  undefined1 uStack_2be;
  undefined1 uStack_2bd;
  undefined4 uStack_2bc;
  ios_base local_268 [272];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  data local_138;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  json_value local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  json_value local_a8;
  json_value local_a0;
  json_value local_98 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  data local_60;
  data local_50;
  data local_40;
  
  local_2f0 = target._M_str;
  pcVar17 = (char *)target._M_len;
  local_2e8 = __return_storage_ptr__;
  if (generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
      ::emptyString_abi_cxx11_ == '\0') {
    generateResults();
  }
  if (command == UNKNOWN) {
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"command","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    command = UNKNOWN;
    if ((json_value *)uVar16 !=
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"command","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
      jStack_2d0 = (json_value)(pbVar9->_M_dataplus)._M_p;
      local_2d8 = (json_value)pbVar9->_M_string_length;
      cVar10 = CLI::std::
               _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&commandMap._M_h,(key_type *)&local_2d8);
      if (cVar10.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
          ._M_cur != (__node_type *)0x0) {
        jStack_2d0 = (json_value)(pbVar9->_M_dataplus)._M_p;
        local_2d8 = (json_value)pbVar9->_M_string_length;
        cVar10 = CLI::std::
                 _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&commandMap._M_h,(key_type *)&local_2d8);
        if (cVar10.
            super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar16 = std::__throw_out_of_range("_Map_base::at");
          if ((json_value *)local_2d8.object != &local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if (jStack_320.object != (object_t *)0x0) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_320.object);
          }
          _Unwind_Resume(uVar16);
        }
        command = *(RestCommand *)
                   ((long)cVar10.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_RestCommand>,_true>
                          ._M_cur + 0x18);
        iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(pbVar9,"status");
        if (iVar8 == 0) {
          query._M_len = 6;
          query._M_str = "status";
        }
      }
    }
  }
  ppVar19 = local_2e8;
  switch(command) {
  case QUERY:
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(brokerName,"query");
    if (iVar8 != 0) {
      iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(brokerName,"search");
      command = QUERY;
      if (iVar8 != 0) break;
    }
    brokerName->_M_string_length = 0;
    *(brokerName->_M_dataplus)._M_p = '\0';
    command = QUERY;
    break;
  case CREATE:
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(brokerName,"create");
    if (iVar8 == 0) {
      brokerName->_M_string_length = 0;
      *(brokerName->_M_dataplus)._M_p = '\0';
      command = CREATE;
    }
    else {
      iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(brokerName,"barrier");
      if (iVar8 == 0) {
        brokerName->_M_string_length = 0;
        *(brokerName->_M_dataplus)._M_p = '\0';
        command = BARRIER;
      }
      else {
        command = CREATE;
        if (pcVar17 == (char *)0x7) {
          iVar8 = bcmp(local_2f0,"barrier",7);
          command = (uint)(iVar8 == 0) * 2 + CREATE;
        }
      }
    }
    break;
  case REMOVE:
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(brokerName,"delete");
    if ((iVar8 == 0) ||
       (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::compare(brokerName,"remove"), iVar8 == 0)) {
      brokerName->_M_string_length = 0;
      *(brokerName->_M_dataplus)._M_p = '\0';
      command = REMOVE;
    }
    else {
      iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(brokerName,"barrier");
      if (iVar8 == 0) {
        brokerName->_M_string_length = 0;
        *(brokerName->_M_dataplus)._M_p = '\0';
        command = CLEAR_BARRIER;
      }
      else {
        command = REMOVE;
        if (pcVar17 == (char *)0x7) {
          iVar8 = bcmp(local_2f0,"barrier",7);
          command = (uint)(iVar8 == 0) * 2 + REMOVE;
        }
      }
    }
    break;
  case UNKNOWN:
    local_2e8->first = NOT_IMPLEMENTED;
    (local_2e8->second)._M_dataplus._M_p = (pointer)&(local_2e8->second).field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8->second,"command not recognized","");
    return ppVar19;
  }
  if (query._M_len == 0) {
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"query","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    if ((json_value *)uVar16 !=
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"query","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      query._M_str = (pbVar9->_M_dataplus)._M_p;
      query._M_len = pbVar9->_M_string_length;
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
    }
  }
  if (pcVar17 == (char *)0x0) {
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"target","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    if ((json_value *)uVar16 !=
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"target","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      local_2f0 = (pbVar9->_M_dataplus)._M_p;
      pcVar17 = (char *)pbVar9->_M_string_length;
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
    }
  }
  if (brokerName->_M_string_length == 0) {
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    if ((json_value *)uVar16 ==
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker_uuid","");
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_128,(key_type *)fields);
      uVar16 = local_128._0_8_;
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
      if ((json_value *)uVar16 ==
          (json_value *)
          ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
        local_2d8.object = (object_t *)&local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"uuid","");
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_128,(key_type *)fields);
        uVar16 = local_128._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((json_value *)uVar16 ==
            (json_value *)
            ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) goto LAB_001c8e64;
        local_2d8.object = (object_t *)&local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"uuid","");
        pbVar9 = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::at(fields,(key_type *)&local_2d8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(brokerName,pbVar9);
      }
      else {
        local_2d8.object = (object_t *)&local_2c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker_uuid","");
        pbVar9 = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::at(fields,(key_type *)&local_2d8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(brokerName,pbVar9);
      }
    }
    else {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(brokerName,pbVar9);
    }
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
  }
LAB_001c8e64:
  if (((brokerName->_M_string_length == 0) &&
      (((pcVar17 == (char *)0x7 && (iVar8 = bcmp(local_2f0,"brokers",7), iVar8 == 0)) ||
       ((query._M_len == 7 && (iVar8 = bcmp(query._M_str,"brokers",7), iVar8 == 0)))))) ||
     (iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(brokerName,"brokers"), iVar8 == 0)) {
    helics::BrokerFactory::getAllBrokers();
    local_158._M_dataplus._M_p = local_158._M_dataplus._M_p & 0xffffffffffffff00;
    local_158._M_string_length = 0;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c8,(initializer_list_t)ZEXT816(0),false,array);
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)&local_158,"brokers");
    vVar1 = (pvVar11->m_data).m_type;
    (pvVar11->m_data).m_type = (value_t)local_c8._M_dataplus._M_p;
    local_c8._M_dataplus._M_p._0_1_ = vVar1;
    jVar21 = (pvVar11->m_data).m_value;
    (pvVar11->m_data).m_value = (json_value)local_c8._M_string_length;
    local_c8._M_string_length = (size_type)jVar21;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_c8);
    if (local_128._0_8_ != local_128._8_8_) {
      pjVar23 = (json_value *)local_128._0_8_;
      do {
        local_2d8.number_unsigned = local_2d8.number_unsigned & 0xffffffffffffff00;
        jStack_2d0.object = (object_t *)0x0;
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (**(code **)(*(long *)&(pjVar23->binary->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 0x58))();
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)local_310,pbVar9);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2d8.boolean,"name");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_310[0];
        local_310[0] = vVar1;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = (json_value)local_310._8_8_;
        local_310._8_8_ = jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_310);
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (**(code **)(*(long *)&(pjVar23->binary->
                                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
                                        .
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data + 0x60))();
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a8,pbVar9);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2d8.boolean,"address");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_a8.boolean;
        local_a8.boolean = (boolean_t)vVar1;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_a0;
        local_a0 = jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_a8);
        bVar6 = (boolean_t)
                (**(code **)(*(long *)&(pjVar23->binary->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data + 0x20))();
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_88,bVar6);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2d8.boolean,"isConnected");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = (value_t)local_88._M_dataplus._M_p;
        local_88._M_dataplus._M_p._0_1_ = vVar1;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value.object = (object_t *)local_88._M_string_length;
        local_88._M_string_length = (size_type)jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_88);
        bVar6 = (boolean_t)
                (**(code **)(*(long *)&(pjVar23->binary->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data + 0x38))();
        local_138 = (data)ZEXT816(0);
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_138,bVar6);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2d8.boolean,"isOpen");
        dVar4 = local_138;
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_138.m_type;
        local_138.m_type = vVar1;
        dVar5 = local_138;
        jVar21 = (json_value)(pvVar11->m_data).m_value.object;
        local_138.m_value = dVar4.m_value;
        (pvVar11->m_data).m_value.number_integer = (number_integer_t)local_138.m_value;
        local_138._0_8_ = dVar5._0_8_;
        local_138.m_value = (json_value)(json_value)jVar21.object;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_138);
        bVar6 = (boolean_t)
                (**(code **)(*(long *)&(pjVar23->binary->
                                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data + 0x30))();
        local_328.object = (object_t *)0x0;
        jStack_320.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_328,bVar6);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_2d8.boolean,"isRoot");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_328.boolean;
        local_328.boolean = (boolean_t)vVar1;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value.object = (object_t *)jStack_320;
        jStack_320 = jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_328);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_158,"brokers");
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar11,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)&local_2d8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_2d8);
        pjVar23 = pjVar23 + 2;
      } while (pjVar23 != (json_value *)local_128._8_8_);
    }
    helics::fileops::generateJsonString((string *)&local_2d8,(json *)&local_158,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)&local_158);
    CLI::std::
    vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
    ~vector((vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
             *)local_128);
    local_2e8->first = OK;
    paVar13 = &(local_2e8->second).field_2;
    (local_2e8->second)._M_dataplus._M_p = (pointer)paVar13;
    if ((json_value *)local_2d8.object == &local_2c8) {
      paVar13->_M_allocated_capacity =
           CONCAT17(local_2c8.number_integer._7_1_,
                    CONCAT25(local_2c8.number_integer._5_2_,
                             CONCAT14(local_2c8.number_integer._4_1_,local_2c8.number_integer._0_4_)
                            ));
      *(ulong *)((long)&(local_2e8->second).field_2 + 8) =
           CONCAT44(uStack_2bc,
                    CONCAT13(uStack_2bd,CONCAT12(uStack_2be,CONCAT11(uStack_2bf,uStack_2c0))));
    }
    else {
      (local_2e8->second)._M_dataplus._M_p = (pointer)local_2d8;
      (local_2e8->second).field_2._M_allocated_capacity =
           CONCAT17(local_2c8.number_integer._7_1_,
                    CONCAT25(local_2c8.number_integer._5_2_,
                             CONCAT14(local_2c8.number_integer._4_1_,local_2c8.number_integer._0_4_)
                            ));
    }
    (local_2e8->second)._M_string_length = (size_type)jStack_2d0;
    return local_2e8;
  }
  local_328.object = (object_t *)0x0;
  jStack_320.object = (object_t *)0x0;
  if ((char *)brokerName->_M_string_length == (char *)0x0) {
    if (pcVar17 != (char *)0x0) {
      brokerName_01._M_str = pcVar17;
      brokerName_01._M_len = (size_t)&local_2d8;
      helics::BrokerFactory::findBroker(brokerName_01);
      goto LAB_001c920f;
    }
  }
  else {
    brokerName_00._M_str = (char *)brokerName->_M_string_length;
    brokerName_00._M_len = (size_t)&local_2d8;
    helics::BrokerFactory::findBroker(brokerName_00);
LAB_001c920f:
    jVar3 = jStack_2d0;
    local_328 = local_2d8;
    jVar21 = jStack_320;
    local_2d8.object = (object_t *)0x0;
    jStack_2d0.object = (object_t *)0x0;
    jStack_320 = jVar3;
    if ((json_value *)jVar21.object != (json_value *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
    }
    if ((json_value *)jStack_2d0.object != (json_value *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0.object);
    }
  }
  if ((json_value *)local_328.object == (json_value *)0x0) {
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    if ((json_value *)uVar16 !=
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      if (query._M_len == 0) {
        query._M_str = local_2f0;
        query._M_len = (size_t)pcVar17;
LAB_001c96c6:
        local_2f0 = (brokerName->_M_dataplus)._M_p;
        pcVar17 = (char *)brokerName->_M_string_length;
      }
      else if (pcVar17 == (char *)0x0) goto LAB_001c96c6;
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"broker","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      brokerName_02._M_str = (char *)pbVar9->_M_string_length;
      brokerName_02._M_len = (size_t)local_128;
      helics::BrokerFactory::findBroker(brokerName_02);
      uVar16 = local_128._8_8_;
      local_328 = (json_value)local_128._0_8_;
      jVar21 = jStack_320;
      local_128._0_8_ = (json_value *)0x0;
      local_128._8_8_ = (json_value *)0x0;
      jStack_320 = (json_value)uVar16;
      if ((json_value *)jVar21.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
      }
      if ((json_value *)local_128._8_8_ != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
    }
  }
  ppVar19 = local_2e8;
  switch(command) {
  case CREATE:
    if ((json_value *)local_328.object == (json_value *)0x0) {
      local_a8.object = (object_t *)local_98;
      local_a0.object = (object_t *)0x0;
      local_98[0].boolean = false;
      local_32a[0] = false;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_2c8.number_integer._0_4_ = 0x73677261;
      jStack_2d0.number_integer = 4;
      local_2c8.number_integer._4_1_ = 0;
      local_2d8.object = (object_t *)&local_2c8;
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_310,(key_type *)fields);
      uVar16 = local_310._0_8_;
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
      if ((pointer)uVar16 !=
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        local_2c8.number_integer._0_4_ = 0x73677261;
        jStack_2d0.number_integer = 4;
        local_2c8.number_integer._4_1_ = 0;
        local_2d8.object = (object_t *)&local_2c8;
        pbVar9 = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::at(fields,(key_type *)&local_2d8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&local_158,pbVar9);
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
      }
      local_2c8.number_integer._0_4_ = 0x65707974;
      jStack_2d0.number_integer = 4;
      local_2c8.number_integer._4_1_ = 0;
      local_2d8.object = (object_t *)&local_2c8;
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_310,(key_type *)fields);
      uVar16 = local_310._0_8_;
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
      if ((pointer)uVar16 ==
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
          (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
        local_2c8.number_integer._0_4_ = 0x65726f43;
        local_2c8.number_integer._4_1_ = 0x54;
        local_2c8.number_integer._5_2_ = 0x7079;
        local_2c8.number_integer._7_1_ = 0x65;
        jStack_2d0.number_integer = 8;
        uStack_2c0 = 0;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_2c8.number_integer._0_4_ = 0x65726f43;
          local_2c8.number_integer._4_1_ = 0x54;
          local_2c8.number_integer._5_2_ = 0x7079;
          local_2c8.number_integer._7_1_ = 0x65;
          jStack_2d0.number_integer = 8;
          uStack_2c0 = 0;
          local_2d8.object = (object_t *)&local_2c8;
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)&local_2d8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(&local_c8,pbVar9);
          goto LAB_001c9d6a;
        }
        local_2c8.number_integer._0_4_ = 0x65726f63;
        local_2c8.number_integer._4_1_ = 0x5f;
        local_2c8.number_integer._5_2_ = 0x7974;
        local_2c8.number_integer._7_1_ = 0x70;
        uStack_2c0 = 0x65;
        uStack_2bf = 0;
        jStack_2d0.number_integer = 9;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_2c8.number_integer._0_4_ = 0x65726f63;
          local_2c8.number_integer._4_1_ = 0x5f;
          local_2c8.number_integer._5_2_ = 0x7974;
          local_2c8.number_integer._7_1_ = 0x70;
          uStack_2c0 = 0x65;
          uStack_2bf = 0;
          jStack_2d0.number_integer = 9;
          local_2d8.object = (object_t *)&local_2c8;
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)&local_2d8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(&local_c8,pbVar9);
          goto LAB_001c9d6a;
        }
      }
      else {
        local_2c8.number_integer._0_4_ = 0x65707974;
        jStack_2d0.number_integer = 4;
        local_2c8.number_integer._4_1_ = 0;
        local_2d8.object = (object_t *)&local_2c8;
        pbVar9 = boost::container::
                 flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                 ::at(fields,(key_type *)&local_2d8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&local_c8,pbVar9);
LAB_001c9d6a:
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
      }
      if ((object_t *)local_c8._M_string_length == (object_t *)0x0) {
        type_01 = DEFAULT;
LAB_001c9e34:
        local_2c8.number_integer._0_4_ = 0x5f6d756e;
        local_2c8.number_integer._4_1_ = 0x66;
        local_2c8.number_integer._5_2_ = 0x6465;
        local_2c8.number_integer._7_1_ = 0x73;
        jStack_2d0.number_integer = 8;
        uStack_2c0 = 0;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_310._16_4_ = 0x5f6d756e;
          local_310[0x14] = 'f';
          local_310._21_2_ = 0x6465;
          local_310[0x17] = 's';
          local_310._8_8_ = 8;
          local_310[0x18] = '\0';
          local_310._0_8_ = (pointer)(local_310 + 0x10);
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)local_310);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2d8," -f ",pbVar9);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_158,(char *)local_2d8.object,jStack_2d0.number_unsigned);
          if (local_2d8.object != (object_t *)&local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
        }
        local_2c8.number_integer._0_4_ = 0x5f6d756e;
        local_2c8.number_integer._4_1_ = 0x62;
        local_2c8.number_integer._5_2_ = 0x6f72;
        local_2c8.number_integer._7_1_ = 0x6b;
        uStack_2c0 = 0x65;
        uStack_2bf = 0x72;
        uStack_2be = 0x73;
        jStack_2d0.number_integer = 0xb;
        uStack_2bd = 0;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_310._16_4_ = 0x5f6d756e;
          local_310[0x14] = 'b';
          local_310._21_2_ = 0x6f72;
          local_310[0x17] = 'k';
          local_310[0x18] = 'e';
          local_310[0x19] = 'r';
          local_310[0x1a] = 's';
          local_310._8_8_ = 0xb;
          local_310[0x1b] = '\0';
          local_310._0_8_ = (pointer)(local_310 + 0x10);
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)local_310);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2d8," --minbrokers=",pbVar9);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_158,(char *)local_2d8.object,jStack_2d0.number_unsigned);
          if (local_2d8.object != (object_t *)&local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
        }
        local_2c8.number_integer._0_4_ = 0x74726f70;
        jStack_2d0.number_integer = 4;
        local_2c8.number_integer._4_1_ = 0;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_310._16_4_ = 0x74726f70;
          local_310._8_8_ = 4;
          local_310[0x14] = '\0';
          local_310._0_8_ = (pointer)(local_310 + 0x10);
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)local_310);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2d8," --port=",pbVar9);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_158,(char *)local_2d8.object,jStack_2d0.number_unsigned);
          if (local_2d8.object != (object_t *)&local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
        }
        local_2c8.number_integer._0_4_ = 0x74736f68;
        jStack_2d0.number_integer = 4;
        local_2c8.number_integer._4_1_ = 0;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_310._16_4_ = 0x74736f68;
          local_310._8_8_ = 4;
          local_310[0x14] = '\0';
          local_310._0_8_ = (pointer)(local_310 + 0x10);
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)local_310);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2d8," --interface=",pbVar9);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_158,(char *)local_2d8.object,jStack_2d0.number_unsigned);
          if (local_2d8.object != (object_t *)&local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
        }
        local_2c8.number_integer._0_4_ = 0x5f676f6c;
        local_2c8.number_integer._4_1_ = 0x6c;
        local_2c8.number_integer._5_2_ = 0x7665;
        local_2c8.number_integer._7_1_ = 0x65;
        uStack_2c0 = 0x6c;
        uStack_2bf = 0;
        jStack_2d0.number_integer = 9;
        local_2d8.object = (object_t *)&local_2c8;
        boost::container::dtl::
        flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_310,(key_type *)fields);
        uVar16 = local_310._0_8_;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
        if ((pointer)uVar16 !=
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
            (fields->m_flat_tree).m_data.m_seq.m_holder.m_size) {
          local_310._16_4_ = 0x5f676f6c;
          local_310[0x14] = 'l';
          local_310._21_2_ = 0x7665;
          local_310[0x17] = 'e';
          local_310[0x18] = 'l';
          local_310[0x19] = '\0';
          local_310._8_8_ = 9;
          local_310._0_8_ = (pointer)(local_310 + 0x10);
          pbVar9 = boost::container::
                   flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
                   ::at(fields,(key_type *)local_310);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_2d8," --loglevel=",pbVar9);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append(&local_158,(char *)local_2d8.object,jStack_2d0.number_unsigned);
          if (local_2d8.object != (object_t *)&local_2c8) {
            operator_delete(local_2d8.object,
                            CONCAT17(local_2c8.number_integer._7_1_,
                                     CONCAT25(local_2c8.number_integer._5_2_,
                                              CONCAT14(local_2c8.number_integer._4_1_,
                                                       local_2c8.number_integer._0_4_))) + 1);
          }
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
        }
        local_32a[1] = 0;
        if (brokerName->_M_string_length == 0) {
          local_138 = (data)boost::uuids::random_generator_pure::operator()(&local_2d9);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8.boolean);
          boost::uuids::operator<<
                    ((basic_ostream<char,_std::char_traits<char>_> *)&local_2d8,(uuid *)&local_138);
          std::__cxx11::stringbuf::str();
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(brokerName,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310);
          if ((pointer)local_310._0_8_ != (pointer)(local_310 + 0x10)) {
            operator_delete((void *)local_310._0_8_,
                            CONCAT17(local_310[0x17],
                                     CONCAT25(local_310._21_2_,
                                              CONCAT14(local_310[0x14],local_310._16_4_))) + 1);
          }
          local_32a[1] = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8.boolean);
          std::ios_base::~ios_base(local_268);
        }
        brokerName_03._M_len = (ulong)type_01;
        configureString._M_str = (char *)local_158._M_string_length;
        configureString._M_len = (size_t)(brokerName->_M_dataplus)._M_p;
        brokerName_03._M_str = (char *)brokerName->_M_string_length;
        helics::BrokerFactory::create((CoreType)&local_2d8,brokerName_03,configureString);
        ppVar19 = local_2e8;
        std::_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string>::
        _Tuple_impl<char_const(&)[1],bool&,std::__cxx11::string&,void>
                  ((_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string> *)local_128,
                   (char (*) [1])0x469b5c,(bool *)(local_32a + 1),&local_c8);
        local_e0 = local_2d8;
        _Stack_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0;
      }
      else {
        type_00._M_str._0_4_ = in_stack_fffffffffffffcc8;
        type_00._M_len = 0x1c9d9f;
        type_00._M_str._4_4_ = in_stack_fffffffffffffccc;
        type_01 = helics::core::coreTypeFromString(type_00);
        bVar7 = helics::core::isCoreTypeAvailable(type_01);
        if (bVar7) goto LAB_001c9e34;
        local_2d8.object = (object_t *)&local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,local_c8._M_dataplus._M_p,
                   &(((_Rep_type *)local_c8._M_string_length)->_M_impl).field_0x0 +
                   (long)local_c8._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8,
                   " is not available");
        ppVar19 = local_2e8;
        local_310._0_8_ = local_310._0_8_ & 0xffffffffffffff00;
        std::_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string>::
        _Tuple_impl<std::__cxx11::string,bool,char_const(&)[1],void>
                  ((_Tuple_impl<1ul,std::__cxx11::string,bool,std::__cxx11::string> *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8,
                   (bool *)local_310,(char (*) [1])0x469b5c);
        local_e0.object = (object_t *)0x0;
        _Stack_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (local_2d8.object != (object_t *)&local_2c8) {
          operator_delete(local_2d8.object,
                          CONCAT17(local_2c8.number_integer._7_1_,
                                   CONCAT25(local_2c8.number_integer._5_2_,
                                            CONCAT14(local_2c8.number_integer._4_1_,
                                                     local_2c8.number_integer._0_4_))) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      local_2d8.object = (object_t *)&local_88;
      jStack_2d0.object = (object_t *)local_32a;
      local_2c8.number_integer._0_4_ = SUB84(&local_a8,0);
      local_2c8.number_integer._4_1_ = (undefined1)((ulong)&local_a8 >> 0x20);
      local_2c8.number_integer._5_2_ = (undefined2)((ulong)&local_a8 >> 0x28);
      local_2c8.number_integer._7_1_ = (undefined1)((ulong)&local_a8 >> 0x38);
      uStack_2c0 = SUB81(&local_328,0);
      uStack_2bf = (undefined1)((ulong)&local_328 >> 8);
      uStack_2be = (undefined1)((ulong)&local_328 >> 0x10);
      uStack_2bd = (undefined1)((ulong)&local_328 >> 0x18);
      uStack_2bc = (undefined4)((ulong)&local_328 >> 0x20);
      std::
      _Tuple_impl<0ul,std::shared_ptr<helics::Broker>&,std::__cxx11::string&,bool&,std::__cxx11::string&>
      ::_M_assign<std::shared_ptr<helics::Broker>,std::__cxx11::string,bool,std::__cxx11::string>
                ((_Tuple_impl<0ul,std::shared_ptr<helics::Broker>&,std::__cxx11::string&,bool&,std::__cxx11::string&>
                  *)&local_2d8.boolean,
                 (_Tuple_impl<0UL,_std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_128);
      if (_Stack_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d8._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_p != &local_f0) {
        operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
      }
      if ((json_value *)local_128._0_8_ != (json_value *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
      }
      if ((json_value *)local_328.object == (json_value *)0x0) {
        ppVar19->first = BAD_REQUEST;
        (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ppVar19->second,local_a8.object,
                   &((local_a0.object)->_M_t)._M_impl.field_0x0 + (long)local_a8.object);
      }
      else {
        local_128._0_8_ = local_128._0_8_ & 0xffffffffffffff00;
        local_128._8_8_ = (json_value *)0x0;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,brokerName);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_128,"broker");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_40.m_type;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_40.m_value;
        local_40.m_type = vVar1;
        local_40.m_value = jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        if ((boolean_t)local_32a[0] == true) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_50,brokerName);
          pvVar11 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)local_128,"broker_uuid");
          vVar1 = (pvVar11->m_data).m_type;
          (pvVar11->m_data).m_type = local_50.m_type;
          jVar21 = (pvVar11->m_data).m_value;
          (pvVar11->m_data).m_value = local_50.m_value;
          local_50.m_type = vVar1;
          local_50.m_value = jVar21;
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_50);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_60,&local_88);
        pvVar11 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)local_128,"type");
        vVar1 = (pvVar11->m_data).m_type;
        (pvVar11->m_data).m_type = local_60.m_type;
        jVar21 = (pvVar11->m_data).m_value;
        (pvVar11->m_data).m_value = local_60.m_value;
        local_60.m_type = vVar1;
        local_60.m_value = jVar21;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_60);
        helics::fileops::generateJsonString((string *)&local_2d8,(json *)local_128,true);
        ppVar19->first = OK;
        paVar13 = &(ppVar19->second).field_2;
        (ppVar19->second)._M_dataplus._M_p = (pointer)paVar13;
        if (local_2d8.object == (object_t *)&local_2c8) {
          paVar13->_M_allocated_capacity =
               CONCAT17(local_2c8.number_integer._7_1_,
                        CONCAT25(local_2c8.number_integer._5_2_,
                                 CONCAT14(local_2c8.number_integer._4_1_,
                                          local_2c8.number_integer._0_4_)));
          *(ulong *)((long)&(ppVar19->second).field_2 + 8) =
               CONCAT44(uStack_2bc,
                        CONCAT13(uStack_2bd,CONCAT12(uStack_2be,CONCAT11(uStack_2bf,uStack_2c0))));
        }
        else {
          (ppVar19->second)._M_dataplus._M_p = (pointer)local_2d8;
          (ppVar19->second).field_2._M_allocated_capacity =
               CONCAT17(local_2c8.number_integer._7_1_,
                        CONCAT25(local_2c8.number_integer._5_2_,
                                 CONCAT14(local_2c8.number_integer._4_1_,
                                          local_2c8.number_integer._0_4_)));
        }
        (ppVar19->second)._M_string_length = (size_type)jStack_2d0;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)local_128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,
                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                 local_88.field_2._M_local_buf[0]) + 1);
      }
      if ((json_value *)local_a8.object == local_98) break;
      lVar20 = CONCAT71(local_98[0].number_integer._1_7_,local_98[0].boolean);
      jVar21 = local_a8;
LAB_001ca59d:
      operator_delete(jVar21.object,lVar20 + 1);
      break;
    }
    local_2d8.object = (object_t *)&local_2c8;
    pcVar2 = (brokerName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar2,pcVar2 + brokerName->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8,
               " already exists");
    ppVar19->first = BAD_REQUEST;
    goto LAB_001c9922;
  case REMOVE:
    if ((json_value *)local_328.object != (json_value *)0x0) {
      (**(code **)(((json_value *)
                   &(local_328.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )->number_integer + 0x18))();
      ppVar19->first = OK;
      (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppVar19->second,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p +
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_string_length);
      break;
    }
    local_2d8.object = (object_t *)&local_2c8;
    pcVar2 = (brokerName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar2,pcVar2 + brokerName->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8,
               " not found");
    ppVar19->first = NOT_FOUND;
LAB_001c9922:
    paVar13 = &(ppVar19->second).field_2;
    (ppVar19->second)._M_dataplus._M_p = (pointer)paVar13;
    if ((json_value *)local_2d8.object == &local_2c8) {
      uVar24 = CONCAT13(local_2c8.number_integer._7_1_,
                        CONCAT21(local_2c8.number_integer._5_2_,local_2c8.number_integer._4_1_));
      uVar25 = CONCAT13(uStack_2bd,CONCAT12(uStack_2be,CONCAT11(uStack_2bf,uStack_2c0)));
LAB_001c99b6:
      *(undefined4 *)paVar13 = local_2c8.number_integer._0_4_;
      *(undefined4 *)((long)paVar13 + 4) = uVar24;
      *(undefined4 *)((long)paVar13 + 8) = uVar25;
      *(undefined4 *)((long)paVar13 + 0xc) = uStack_2bc;
    }
    else {
      (ppVar19->second)._M_dataplus._M_p = (pointer)local_2d8;
LAB_001c9938:
      (ppVar19->second).field_2._M_allocated_capacity =
           CONCAT17(local_2c8.number_integer._7_1_,
                    CONCAT25(local_2c8.number_integer._5_2_,
                             CONCAT14(local_2c8.number_integer._4_1_,local_2c8.number_integer._0_4_)
                            ));
    }
    (ppVar19->second)._M_string_length = (size_type)jStack_2d0;
    break;
  case BARRIER:
    if ((json_value *)local_328.object == (json_value *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      jVar3 = jStack_2d0;
      local_328 = local_2d8;
      jVar21 = jStack_320;
      local_2d8.object = (object_t *)0x0;
      jStack_2d0.object = (object_t *)0x0;
      jStack_320.string = jVar3.string;
      if ((json_value *)jVar21.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
      }
      if ((json_value *)jStack_2d0.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0.object);
      }
      if ((json_value *)local_328.object == (json_value *)0x0) {
        local_2d8.number_integer._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (ppVar19,(RequestReturnVal *)&local_2d8.number_unsigned,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"time","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    if ((json_value *)uVar16 ==
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      (**(code **)(((json_value *)
                   &(local_328.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )->number_integer + 0xd8))();
      ppVar19->first = OK;
      (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppVar19->second,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p +
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_string_length);
    }
    else {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"time","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      timeString._M_str = extraout_RDX;
      timeString._M_len = (size_t)(pbVar9->_M_dataplus)._M_p;
      TVar12 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                         ((utilities *)pbVar9->_M_string_length,timeString);
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
      if (TVar12.internalTimeCode < 0) {
        (**(code **)(((json_value *)
                     &(local_328.array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     )->number_integer + 0xd8))();
      }
      else {
        (**(code **)(((json_value *)
                     &(local_328.array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     )->number_integer + 0xd0))(local_328.object,TVar12.internalTimeCode);
      }
      ppVar19->first = OK;
      (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppVar19->second,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p,
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_dataplus._M_p +
                 generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
                 ::emptyString_abi_cxx11_._M_string_length);
    }
    break;
  case CLEAR_BARRIER:
    if ((json_value *)local_328.object == (json_value *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      jVar3 = jStack_2d0;
      local_328 = local_2d8;
      jVar21 = jStack_320;
      local_2d8.object = (object_t *)0x0;
      jStack_2d0.object = (object_t *)0x0;
      jStack_320.string = jVar3.string;
      if ((json_value *)jVar21.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
      }
      if ((json_value *)jStack_2d0.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0.object);
      }
      if ((json_value *)local_328.object == (json_value *)0x0) {
        local_2d8.number_integer._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (ppVar19,(RequestReturnVal *)&local_2d8.number_unsigned,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    (**(code **)(((json_value *)
                 &(local_328.array)->
                  super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 )->number_integer + 0xd8))();
    ppVar19->first = OK;
    (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ppVar19->second,
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_dataplus._M_p,
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_dataplus._M_p +
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_string_length);
    break;
  case COMMAND:
    if ((json_value *)local_328.object == (json_value *)0x0) {
      helics::BrokerFactory::getConnectedBroker();
      jVar3 = jStack_2d0;
      local_328 = local_2d8;
      jVar21 = jStack_320;
      local_2d8.object = (object_t *)0x0;
      jStack_2d0.object = (object_t *)0x0;
      jStack_320.string = jVar3.string;
      if ((json_value *)jVar21.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
      }
      if ((json_value *)jStack_2d0.object != (json_value *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0.object);
      }
      if ((json_value *)local_328.object == (json_value *)0x0) {
        local_2d8.number_integer._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (ppVar19,(RequestReturnVal *)&local_2d8.number_unsigned,
                   (char (*) [24])"unable to locate broker");
        break;
      }
    }
    local_2d8.object = (object_t *)&local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"command_str","");
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::find((flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_128,(key_type *)fields);
    uVar16 = local_128._0_8_;
    if (local_2d8.object != (object_t *)&local_2c8) {
      operator_delete(local_2d8.object,
                      CONCAT17(local_2c8.number_integer._7_1_,
                               CONCAT25(local_2c8.number_integer._5_2_,
                                        CONCAT14(local_2c8.number_integer._4_1_,
                                                 local_2c8.number_integer._0_4_))) + 1);
    }
    jVar21 = local_328;
    if ((json_value *)uVar16 ==
        (json_value *)
        ((fields->m_flat_tree).m_data.m_seq.m_holder.m_start +
        (fields->m_flat_tree).m_data.m_seq.m_holder.m_size)) {
      if (query._M_len == 0) {
        local_2d8.number_integer._0_4_ = 400;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[24],_true>
                  (ppVar19,(RequestReturnVal *)&local_2d8.number_unsigned,
                   (char (*) [24])"no valid command string");
        break;
      }
      (**(code **)(((json_value *)
                   &(local_328.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )->number_integer + 0x98))
                (local_328.object,pcVar17,local_2f0,query._M_len,query._M_str,0);
    }
    else {
      local_2d8.object = (object_t *)&local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"command_str","");
      pbVar9 = boost::container::
               flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               ::at(fields,(key_type *)&local_2d8);
      (**(code **)(((json_value *)
                   &(jVar21.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )->number_integer + 0x98))
                (jVar21.object,pcVar17,local_2f0,pbVar9->_M_string_length,(pbVar9->_M_dataplus)._M_p
                 ,0);
      if (local_2d8.object != (object_t *)&local_2c8) {
        operator_delete(local_2d8.object,
                        CONCAT17(local_2c8.number_integer._7_1_,
                                 CONCAT25(local_2c8.number_integer._5_2_,
                                          CONCAT14(local_2c8.number_integer._4_1_,
                                                   local_2c8.number_integer._0_4_))) + 1);
      }
    }
    ppVar19->first = OK;
    (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ppVar19->second,
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_dataplus._M_p,
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_dataplus._M_p +
               generateResults(RestCommand,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>const&)
               ::emptyString_abi_cxx11_._M_string_length);
    break;
  default:
    if ((json_value *)local_328.object != (json_value *)0x0) {
      if ((query._M_len == 0) && (pcVar17 != (char *)0x0)) {
        query._M_str = local_2f0;
        bVar7 = true;
        pcVar14 = "root";
        pcVar22 = (char *)0x4;
        query._M_len = (size_t)pcVar17;
      }
      else {
LAB_001c9bf0:
        bVar7 = false;
        pcVar14 = local_2f0;
        pcVar22 = pcVar17;
      }
LAB_001c9bf5:
      pcVar17 = (char *)0x4;
      if (pcVar22 != (char *)0x0) {
        pcVar17 = pcVar22;
      }
      pcVar18 = "root";
      if (pcVar22 != (char *)0x0) {
        pcVar18 = pcVar14;
      }
      if (query._M_len == 0) {
        query._M_len = 0xd;
        query._M_str = "current_state";
      }
      (**(code **)(((json_value *)
                   &(local_328.array)->
                    super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )->number_integer + 0x88))
                (&local_2d8,local_328.object,pcVar17,pcVar18,query._M_len,query._M_str,0);
      sVar15 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_2d8,"\"error\"",0,7);
      if (sVar15 == 0xffffffffffffffff) {
        ppVar19->first = OK;
        (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&ppVar19->second,local_2d8.object,
                   (long)&(local_2d8.object)->_M_t + (long)jStack_2d0.object);
      }
      else if (bVar7) {
        (**(code **)(((json_value *)
                     &(local_328.array)->
                      super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     )->number_integer + 0x88))
                  (local_128,local_328.object,query._M_len,query._M_str,0xd,"current_state",0);
        generateResults();
        if ((extraout_RAX & 1) == 0) {
          local_158._M_dataplus._M_p._0_4_ = 0x194;
          CLI::std::
          pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<RequestReturnVal,_const_char_(&)[17],_true>
                    (ppVar19,(RequestReturnVal *)&local_158,(char (*) [17])"target not found");
        }
        else {
          ppVar19->first = OK;
          (ppVar19->second)._M_dataplus._M_p = (pointer)&(ppVar19->second).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&ppVar19->second,local_2d8.object,
                     (long)&(local_2d8.object)->_M_t + (long)jStack_2d0.object);
        }
      }
      else {
        local_128._0_4_ = 0x194;
        CLI::std::
        pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<RequestReturnVal,_const_char_(&)[21],_true>
                  (ppVar19,(RequestReturnVal *)local_128,(char (*) [21])"query not recognized");
      }
      if ((json_value *)local_2d8.object == &local_2c8) break;
      lVar20 = CONCAT17(local_2c8.number_integer._7_1_,
                        CONCAT25(local_2c8.number_integer._5_2_,
                                 CONCAT14(local_2c8.number_integer._4_1_,
                                          local_2c8.number_integer._0_4_)));
      jVar21 = local_2d8;
      goto LAB_001ca59d;
    }
    helics::BrokerFactory::getConnectedBroker();
    jVar3 = jStack_2d0;
    local_328 = local_2d8;
    ppVar19 = local_2e8;
    jVar21 = jStack_320;
    local_2d8.object = (object_t *)0x0;
    jStack_2d0.object = (object_t *)0x0;
    jStack_320.string = jVar3.string;
    if ((json_value *)jVar21.object != (json_value *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jVar21.object);
    }
    if ((json_value *)jStack_2d0.object != (json_value *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_2d0.object);
    }
    if ((json_value *)local_328.object != (json_value *)0x0) {
      if (pcVar17 == (char *)0x0) {
        query._M_str = (brokerName->_M_dataplus)._M_p;
        query._M_len = brokerName->_M_string_length;
        goto LAB_001c9bf0;
      }
      query._M_str = local_2f0;
      pcVar14 = (brokerName->_M_dataplus)._M_p;
      pcVar22 = (char *)brokerName->_M_string_length;
      bVar7 = false;
      query._M_len = (size_t)pcVar17;
      goto LAB_001c9bf5;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2d8,
                   brokerName," not found and no valid brokers");
    ppVar19->first = NOT_FOUND;
    paVar13 = &(ppVar19->second).field_2;
    (ppVar19->second)._M_dataplus._M_p = (pointer)paVar13;
    if ((json_value *)local_2d8.object != &local_2c8) {
      (ppVar19->second)._M_dataplus._M_p = (pointer)local_2d8;
      goto LAB_001c9938;
    }
    uVar24 = CONCAT13(local_2c8.number_integer._7_1_,
                      CONCAT21(local_2c8.number_integer._5_2_,local_2c8.number_integer._4_1_));
    uVar25 = CONCAT13(uStack_2bd,CONCAT12(uStack_2be,CONCAT11(uStack_2bf,uStack_2c0)));
    goto LAB_001c99b6;
  }
  if ((json_value *)jStack_320.object != (json_value *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)jStack_320.object);
  }
  return ppVar19;
}

Assistant:

static std::pair<RequestReturnVal, std::string>
    generateResults(RestCommand command,
                    std::string brokerName,
                    std::string_view target,
                    std::string_view query,
                    const boost::container::flat_map<std::string, std::string>& fields)
{
    static const std::string emptyString;
    if (command == RestCommand::UNKNOWN) {
        if (fields.find("command") != fields.end()) {
            const auto& cmdstr = fields.at("command");
            if (commandMap.find(cmdstr) != commandMap.end()) {
                command = commandMap.at(cmdstr);
                if (cmdstr == "status") {
                    query = "status";
                }
            }
        }
    }
    switch (command) {
        case RestCommand::UNKNOWN:
            return {RequestReturnVal::NOT_IMPLEMENTED, "command not recognized"};
        case RestCommand::CREATE:
            if (brokerName == "create") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::BARRIER;
            }
            break;
        case RestCommand::REMOVE:
            if (brokerName == "delete" || brokerName == "remove") {
                brokerName.clear();
                break;
            }
            if (brokerName == "barrier") {
                brokerName.clear();
                command = RestCommand::CLEAR_BARRIER;
                break;
            }
            if (target == "barrier") {
                command = RestCommand::CLEAR_BARRIER;
            }
            break;
        case RestCommand::QUERY:
            if (brokerName == "query" || brokerName == "search") {
                brokerName.clear();
            }
            break;
        default:
            break;
    }

    if (query.empty() && fields.find("query") != fields.end()) {
        query = fields.at("query");
    }
    if (target.empty() && fields.find("target") != fields.end()) {
        target = fields.at("target");
    }
    if (brokerName.empty()) {
        if (fields.find("broker") != fields.end()) {
            brokerName = fields.at("broker");
        } else if (fields.find("broker_uuid") != fields.end()) {
            brokerName = fields.at("broker_uuid");
        } else if (fields.find("uuid") != fields.end()) {
            brokerName = fields.at("uuid");
        }
    }
    if ((brokerName.empty() && (target == "brokers" || query == "brokers")) ||
        brokerName == "brokers") {
        return {RequestReturnVal::OK, getBrokerList()};
    }

    std::shared_ptr<helics::Broker> brkr;
    if (brokerName.empty()) {
        if (!target.empty()) {
            brkr = helics::BrokerFactory::findBroker(target);
        }
    } else {
        brkr = helics::BrokerFactory::findBroker(brokerName);
    }

    if (!brkr) {
        if (fields.find("broker") != fields.end()) {
            if (query.empty()) {
                query = target;
                target = brokerName;
            } else if (target.empty()) {
                target = brokerName;
            }
            brkr = helics::BrokerFactory::findBroker(fields.at("broker"));
        }
    }
    switch (command) {
        case RestCommand::CREATE: {
            if (brkr) {
                return {RequestReturnVal::BAD_REQUEST, brokerName + " already exists"};
            }
            std::string errorMessage;
            bool useUuid{false};
            std::string type;
            std::tie(brkr, errorMessage, useUuid, type) = createBroker(brokerName, fields);

            if (!brkr) {
                return {RequestReturnVal::BAD_REQUEST, errorMessage};
            }
            nlohmann::json retJson;
            retJson["broker"] = brokerName;
            if (useUuid) {
                retJson["broker_uuid"] = brokerName;
            }
            retJson["type"] = type;
            return {RequestReturnVal::OK, helics::fileops::generateJsonString(retJson)};
        }
        case RestCommand::REMOVE:
            if (!brkr) {
                return {RequestReturnVal::NOT_FOUND, brokerName + " not found"};
            }
            brkr->disconnect();
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::BARRIER: {
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("time") == fields.end()) {
                brkr->clearTimeBarrier();
                return {RequestReturnVal::OK, emptyString};
            }
            auto bTime = gmlc::utilities::loadTimeFromString<helics::Time>(fields.at("time"));
            if (bTime >= helics::timeZero) {
                brkr->setTimeBarrier(bTime);
            } else {
                brkr->clearTimeBarrier();
            }
            return {RequestReturnVal::OK, emptyString};
        }
        case RestCommand::COMMAND:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }
            if (fields.find("command_str") != fields.end()) {
                brkr->sendCommand(target, fields.at("command_str"));
            } else if (!query.empty()) {
                brkr->sendCommand(target, query);
            } else {
                return {RequestReturnVal::BAD_REQUEST, "no valid command string"};
            }
            return {RequestReturnVal::OK, emptyString};
        case RestCommand::CLEAR_BARRIER:
            if (!brkr) {
                brkr = helics::BrokerFactory::getConnectedBroker();
                if (!brkr) {
                    return {RequestReturnVal::NOT_FOUND, "unable to locate broker"};
                }
            }

            brkr->clearTimeBarrier();
            return {RequestReturnVal::OK, emptyString};
        default:
            break;
    }  // end switch

    bool autoquery{false};
    if (!brkr) {
        brkr = helics::BrokerFactory::getConnectedBroker();
        if (!brkr) {
            return {RequestReturnVal::NOT_FOUND, brokerName + " not found and no valid brokers"};
        }
        if (target.empty()) {
            query = brokerName;
        } else {
            query = target;
            target = brokerName;
        }

    } else if (query.empty() && !target.empty()) {
        query = target;
        autoquery = true;
        target = "root";
    }
    if (target.empty()) {
        target = "root";
    }
    if (query.empty()) {
        query = "current_state";
    }
    auto res = brkr->query(target, query);
    if (res.find("\"error\"") == std::string::npos) {
        return {RequestReturnVal::OK, res};
    }

    if (autoquery) {
        res = brkr->query(query, "current_state");
        if (res.find("\"error\"") != std::string::npos) {
            return {RequestReturnVal::NOT_FOUND, "target not found"};
        }
        return {RequestReturnVal::OK, res};
    }
    return {RequestReturnVal::NOT_FOUND, "query not recognized"};
}